

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O2

void __thiscall
QNetworkAccessBackend::QNetworkAccessBackend
          (QNetworkAccessBackend *this,TargetTypes targetTypes,SecurityFeatures securityFeatures,
          IOFeatures ioFeatures)

{
  long lVar1;
  QNetworkAccessBackendPrivate *this_00;
  
  this_00 = (QNetworkAccessBackendPrivate *)operator_new(0xb8);
  QNetworkAccessBackendPrivate::QNetworkAccessBackendPrivate(this_00);
  QObject::QObject((QObject *)this,(QObjectPrivate *)this_00,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002c9298;
  lVar1 = *(long *)(this + 8);
  ((QFlagsStorageHelper<QNetworkAccessBackend::TargetType,_4> *)(lVar1 + 0x78))->
  super_QFlagsStorage<QNetworkAccessBackend::TargetType> =
       (QFlagsStorage<QNetworkAccessBackend::TargetType>)
       targetTypes.super_QFlagsStorageHelper<QNetworkAccessBackend::TargetType,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::TargetType>.i;
  ((QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4> *)(lVar1 + 0x7c))->
  super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature> =
       (QFlagsStorage<QNetworkAccessBackend::SecurityFeature>)
       securityFeatures.super_QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature>.i;
  ((QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4> *)(lVar1 + 0x80))->
  super_QFlagsStorage<QNetworkAccessBackend::IOFeature> =
       (QFlagsStorage<QNetworkAccessBackend::IOFeature>)
       ioFeatures.super_QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4>.
       super_QFlagsStorage<QNetworkAccessBackend::IOFeature>.i;
  return;
}

Assistant:

QNetworkAccessBackend::QNetworkAccessBackend(TargetTypes targetTypes,
                                             SecurityFeatures securityFeatures,
                                             IOFeatures ioFeatures)
    : QObject(*(new QNetworkAccessBackendPrivate), nullptr)
{
    Q_D(QNetworkAccessBackend);
    d->m_targetTypes = targetTypes;
    d->m_securityFeatures = securityFeatures;
    d->m_ioFeatures = ioFeatures;
}